

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLExtensionHandler.h
# Opt level: O0

void __thiscall
irr::video::COpenGLExtensionHandler::irrGlGenFramebuffers
          (COpenGLExtensionHandler *this,GLsizei n,GLuint *framebuffers)

{
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  
  if (in_RDX != (void *)0x0) {
    memset(in_RDX,0,(long)in_ESI << 2);
  }
  if (*(long *)(in_RDI + 0x470) == 0) {
    if (*(long *)(in_RDI + 0x4c8) != 0) {
      (**(code **)(in_RDI + 0x4c8))(in_ESI,in_RDX);
    }
  }
  else {
    (**(code **)(in_RDI + 0x470))(in_ESI,in_RDX);
  }
  return;
}

Assistant:

inline void COpenGLExtensionHandler::irrGlGenFramebuffers(GLsizei n, GLuint *framebuffers)
{
	if (framebuffers)
		memset(framebuffers, 0, n * sizeof(GLuint));
	if (pGlGenFramebuffers)
		pGlGenFramebuffers(n, framebuffers);
	else if (pGlGenFramebuffersEXT)
		pGlGenFramebuffersEXT(n, framebuffers);
}